

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall Js::JavascriptArray::SetLength(JavascriptArray *this,Var newLength)

{
  bool bVar1;
  ImplicitCallFlags IVar2;
  uint32 uVar3;
  ScriptContext *pSVar4;
  ThreadContext *pTVar5;
  double dVar6;
  ImplicitCallFlags flags;
  ThreadContext *threadContext;
  double dblValue;
  uint32 uintValue;
  int32 lenValue;
  ScriptContext *scriptContext;
  Var newLength_local;
  JavascriptArray *this_local;
  
  bVar1 = TaggedInt::Is(newLength);
  if (bVar1) {
    uVar3 = TaggedInt::ToInt32(newLength);
    if ((int)uVar3 < 0) {
      pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      pTVar5 = ScriptContext::GetThreadContext(pSVar4);
      bVar1 = ThreadContext::RecordImplicitException(pTVar5);
      if (bVar1) {
        JavascriptError::ThrowRangeError(pSVar4,-0x7ff5ec5a,(PCWSTR)0x0);
      }
    }
    else {
      SetLength(this,uVar3);
    }
  }
  else {
    pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    uVar3 = JavascriptConversion::ToUInt32(newLength,pSVar4);
    dVar6 = JavascriptConversion::ToNumber(newLength,pSVar4);
    if ((dVar6 != (double)uVar3) || (NAN(dVar6) || NAN((double)uVar3))) {
      pTVar5 = ScriptContext::GetThreadContext(pSVar4);
      IVar2 = ThreadContext::GetImplicitCallFlags(pTVar5);
      if (((IVar2 == ImplicitCall_None) ||
          (bVar1 = ThreadContext::IsDisableImplicitCall(pTVar5), !bVar1)) &&
         (bVar1 = ThreadContext::RecordImplicitException(pTVar5), bVar1)) {
        JavascriptError::ThrowRangeError(pSVar4,-0x7ff5ec5a,(PCWSTR)0x0);
      }
    }
    else {
      pTVar5 = ScriptContext::GetThreadContext(pSVar4);
      ThreadContext::AddImplicitCallFlags(pTVar5,ImplicitCall_Accessor);
      SetLength(this,uVar3);
    }
  }
  return 1;
}

Assistant:

BOOL JavascriptArray::SetLength(Var newLength)
    {
        ScriptContext *scriptContext;
        if(TaggedInt::Is(newLength))
        {
            int32 lenValue = TaggedInt::ToInt32(newLength);
            if (lenValue < 0)
            {
                scriptContext = GetScriptContext();
                if (scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
                }
            }
            else
            {
                this->SetLength(lenValue);
            }
            return TRUE;
        }

        scriptContext = GetScriptContext();
        uint32 uintValue = JavascriptConversion::ToUInt32(newLength, scriptContext);
        double dblValue = JavascriptConversion::ToNumber(newLength, scriptContext);
        if (dblValue == uintValue)
        {
            // Conversion can change the type (e.g. from String), invalidating assumptions made by the JIT
            scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_Accessor);

            this->SetLength(uintValue);
        }
        else
        {
            ThreadContext* threadContext = scriptContext->GetThreadContext();
            ImplicitCallFlags flags = threadContext->GetImplicitCallFlags();
            if (flags != ImplicitCall_None && threadContext->IsDisableImplicitCall())
            {
                // We couldn't execute the implicit call(s) needed to convert the newLength to an integer.
                // Do nothing and let the jitted code bail out.
                return TRUE;
            }

            if (threadContext->RecordImplicitException())
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
            }
        }

        return TRUE;
    }